

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

int * Wlc_VecLoadFanins(Vec_Int_t *vOut,int *pFanins,int nFanins,int nTotal,int fSigned)

{
  int iVar1;
  int Entry;
  ulong uVar2;
  
  if (fSigned == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = pFanins[(long)nFanins + -1];
  }
  vOut->nSize = 0;
  if (nFanins <= nTotal) {
    if (0 < nTotal) {
      uVar2 = 0;
      do {
        Entry = iVar1;
        if ((long)uVar2 < (long)nFanins) {
          Entry = pFanins[uVar2];
        }
        Vec_IntPush(vOut,Entry);
        uVar2 = uVar2 + 1;
      } while ((uint)nTotal != uVar2);
    }
    return vOut->pArray;
  }
  __assert_fail("nFanins <= nTotal",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                ,0x58,"int *Wlc_VecLoadFanins(Vec_Int_t *, int *, int, int, int)");
}

Assistant:

int * Wlc_VecLoadFanins( Vec_Int_t * vOut, int * pFanins, int nFanins, int nTotal, int fSigned )
{
    int Fill = fSigned ? pFanins[nFanins-1] : 0;
    int i; Vec_IntClear( vOut );
    assert( nFanins <= nTotal );
    for( i = 0; i < nTotal; i++) 
        Vec_IntPush( vOut, i < nFanins ? pFanins[i] : Fill );
    return Vec_IntArray( vOut );
}